

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O2

void __thiscall
coro_io::
callback_awaitor_base<async_simple::Try<bool>,coro_io::callback_awaitor<async_simple::Try<bool>>>::
awaitor_handler::set_value<async_simple::Try<bool>>(awaitor_handler *this,Try<int> *args)

{
  std::__detail::__variant::
  _Move_assign_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr>::operator=
            ((_Move_assign_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)
             (*(long *)this + 8),
             (_Move_assign_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)
             args);
  return;
}

Assistant:

void set_value(Args &&...args) const {
      if constexpr (!std::is_void_v<Arg>) {
        obj->arg_ = {std::forward<Args>(args)...};
      }
    }